

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like_optimizations.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::LikeOptimizationRule::Apply
          (LikeOptimizationRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  char cVar1;
  ulong uVar2;
  pointer pcVar3;
  long lVar4;
  int iVar5;
  reference pvVar6;
  BoundFunctionExpression *function;
  BoundConstantExpression *pBVar7;
  ClientContext *context;
  string *psVar8;
  reference pvVar9;
  reference pvVar10;
  BoundComparisonExpression *this_00;
  ulong uVar11;
  ulong uVar12;
  pointer *__ptr;
  ulong uVar13;
  BoundFunctionExpression *pBVar14;
  BaseScalarFunction *this_01;
  bool bVar15;
  bool bVar16;
  Value constant_value;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_4a8;
  undefined1 *local_4a0 [2];
  undefined1 local_490 [16];
  undefined1 *local_480 [2];
  undefined1 local_470 [16];
  undefined1 *local_460 [2];
  undefined1 local_450 [16];
  LogicalType local_440;
  Value local_428;
  Value local_3e8;
  BaseScalarFunction local_3a8;
  undefined1 local_2f8 [16];
  code *local_2e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_288;
  BaseScalarFunction local_280;
  undefined1 local_1d0 [16];
  code *local_1c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_160;
  ScalarFunction local_158;
  
  pvVar6 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  function = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                       (&pvVar6->_M_data->super_BaseExpression);
  pvVar6 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,2);
  pBVar7 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                     (&pvVar6->_M_data->super_BaseExpression);
  if ((pBVar7->value).is_null == true) {
    LogicalType::LogicalType(&local_440,&(function->super_Expression).return_type);
    Value::Value(&local_428,&local_440);
    pBVar7 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value(&local_3e8,&local_428);
    BoundConstantExpression::BoundConstantExpression(pBVar7,&local_3e8);
    Value::~Value(&local_3e8);
    (this->super_Rule)._vptr_Rule = (_func_int **)pBVar7;
    Value::~Value(&local_428);
    LogicalType::~LogicalType(&local_440);
    return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
  }
  iVar5 = (*(pBVar7->super_Expression).super_BaseExpression._vptr_BaseExpression[0xf])(pBVar7);
  if ((char)iVar5 == '\0') {
    (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
    return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
  }
  context = Rule::GetContext((Rule *)op);
  ExpressionExecutor::EvaluateScalar(&local_3e8,context,&pBVar7->super_Expression,false);
  psVar8 = StringValue::Get_abi_cxx11_(&local_3e8);
  iVar5 = ::std::__cxx11::string::compare
                    ((char *)&(function->function).super_BaseScalarFunction.super_SimpleFunction.
                              super_Function.name);
  uVar2 = psVar8->_M_string_length;
  bVar15 = uVar2 == 0;
  if (!bVar15) {
    bVar15 = false;
    uVar12 = 1;
    do {
      cVar1 = (psVar8->_M_dataplus)._M_p[uVar12 - 1];
      if ((cVar1 == '%') || (cVar1 == '_')) break;
      bVar15 = uVar2 <= uVar12;
      bVar16 = uVar12 != uVar2;
      uVar12 = uVar12 + 1;
    } while (bVar16);
  }
  if (bVar15) {
    pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](&function->children,0);
    pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[](&function->children,1);
    this_00 = (BoundComparisonExpression *)operator_new(0x68);
    local_428.type_._0_8_ =
         (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    local_4a8._M_head_impl =
         (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    BoundComparisonExpression::BoundComparisonExpression
              (this_00,(iVar5 == 0) + COMPARE_BOUNDARY_START,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_428,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_4a8);
    if (local_4a8._M_head_impl != (Expression *)0x0) {
      (*((local_4a8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_4a8._M_head_impl = (Expression *)0x0;
    if ((Expression *)local_428.type_._0_8_ != (Expression *)0x0) {
      (*((BaseExpression *)local_428.type_._0_8_)->_vptr_BaseExpression[1])();
    }
    (this->super_Rule)._vptr_Rule = (_func_int **)this_00;
  }
  else {
    pcVar3 = (psVar8->_M_dataplus)._M_p;
    uVar12 = uVar2 + 1;
    do {
      if (uVar12 == 1) {
        uVar11 = 0;
        break;
      }
      uVar11 = uVar12 - 1;
      lVar4 = uVar12 - 2;
      uVar12 = uVar11;
    } while (pcVar3[lVar4] == '%');
    if (uVar11 != uVar2) {
      do {
        if (uVar11 == 0) {
          PrefixFun::GetFunction();
          pBVar14 = (BoundFunctionExpression *)(psVar8->_M_dataplus)._M_p;
          local_460[0] = local_450;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_460,pBVar14,
                     (pointer)((long)&(pBVar14->super_Expression).super_BaseExpression.
                                      _vptr_BaseExpression + psVar8->_M_string_length));
          ApplyRule(this,pBVar14,(ScalarFunction *)function,(string *)&local_280,SUB81(local_460,0))
          ;
          if (local_460[0] != local_450) {
            operator_delete(local_460[0]);
          }
          local_280.super_SimpleFunction.super_Function._vptr_Function =
               (_func_int **)&PTR__ScalarFunction_02476950;
          if (local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160);
          }
          if (local_1c0 != (code *)0x0) {
            (*local_1c0)(local_1d0,local_1d0,3);
          }
          this_01 = &local_280;
          goto LAB_00d40b38;
        }
        lVar4 = uVar11 - 1;
      } while ((pcVar3[lVar4] != '%') && (uVar11 = uVar11 - 1, pcVar3[lVar4] != '_'));
    }
    uVar11 = 0;
    uVar12 = uVar11;
    if (uVar2 != 0) {
      do {
        uVar12 = uVar11;
        if (pcVar3[uVar11] != '%') break;
        uVar11 = uVar11 + 1;
        uVar12 = uVar2;
      } while (uVar2 != uVar11);
    }
    if (uVar12 == 0) {
LAB_00d409a7:
      uVar11 = 0;
      uVar12 = uVar11;
      if (uVar2 != 0) {
        do {
          uVar12 = uVar11;
          if (pcVar3[uVar11] != '%') break;
          uVar11 = uVar11 + 1;
          uVar12 = uVar2;
        } while (uVar2 != uVar11);
      }
      uVar11 = uVar2 + 1;
      do {
        if (uVar11 == 1) {
          uVar13 = 0;
          break;
        }
        uVar13 = uVar11 - 1;
        lVar4 = uVar11 - 2;
        uVar11 = uVar13;
      } while (pcVar3[lVar4] == '%');
      if (uVar13 != uVar2 && uVar12 != 0) {
        bVar15 = uVar13 <= uVar12;
        if (!bVar15) {
          bVar15 = false;
          do {
            if ((pcVar3[uVar12] == '%') || (pcVar3[uVar12] == '_')) break;
            uVar12 = uVar12 + 1;
            bVar15 = uVar12 >= uVar13;
          } while (uVar12 < uVar13);
        }
        if (bVar15) {
          GetStringContains();
          pBVar14 = (BoundFunctionExpression *)(psVar8->_M_dataplus)._M_p;
          local_4a0[0] = local_490;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4a0,pBVar14,
                     (pointer)((long)&(pBVar14->super_Expression).super_BaseExpression.
                                      _vptr_BaseExpression + psVar8->_M_string_length));
          ApplyRule(this,pBVar14,(ScalarFunction *)function,(string *)&local_158,SUB81(local_4a0,0))
          ;
          if (local_4a0[0] != local_490) {
            operator_delete(local_4a0[0]);
          }
          ScalarFunction::~ScalarFunction(&local_158);
          goto LAB_00d40b3d;
        }
      }
      (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
    }
    else {
      if (uVar12 < uVar2) {
        do {
          if ((pcVar3[uVar12] == '%') || (pcVar3[uVar12] == '_')) goto LAB_00d409a7;
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
      SuffixFun::GetFunction();
      pBVar14 = (BoundFunctionExpression *)(psVar8->_M_dataplus)._M_p;
      local_480[0] = local_470;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_480,pBVar14,
                 (pointer)((long)&(pBVar14->super_Expression).super_BaseExpression.
                                  _vptr_BaseExpression + psVar8->_M_string_length));
      ApplyRule(this,pBVar14,(ScalarFunction *)function,(string *)&local_3a8,SUB81(local_480,0));
      if (local_480[0] != local_470) {
        operator_delete(local_480[0]);
      }
      local_3a8.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__ScalarFunction_02476950;
      if (local_288 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288);
      }
      if (local_2e8 != (code *)0x0) {
        (*local_2e8)(local_2f8,local_2f8,3);
      }
      this_01 = &local_3a8;
LAB_00d40b38:
      BaseScalarFunction::~BaseScalarFunction(this_01);
    }
  }
LAB_00d40b3d:
  Value::~Value(&local_3e8);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> LikeOptimizationRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                   bool &changes_made, bool is_root) {
	auto &root = bindings[0].get().Cast<BoundFunctionExpression>();
	auto &constant_expr = bindings[2].get().Cast<BoundConstantExpression>();
	D_ASSERT(root.children.size() == 2);

	if (constant_expr.value.IsNull()) {
		return make_uniq<BoundConstantExpression>(Value(root.return_type));
	}

	// the constant_expr is a scalar expression that we have to fold
	if (!constant_expr.IsFoldable()) {
		return nullptr;
	}

	auto constant_value = ExpressionExecutor::EvaluateScalar(GetContext(), constant_expr);
	D_ASSERT(constant_value.type() == constant_expr.return_type);
	auto &patt_str = StringValue::Get(constant_value);

	bool is_not_like = root.function.name == "!~~";
	if (PatternIsConstant(patt_str)) {
		// Pattern is constant
		return make_uniq<BoundComparisonExpression>(is_not_like ? ExpressionType::COMPARE_NOTEQUAL
		                                                        : ExpressionType::COMPARE_EQUAL,
		                                            std::move(root.children[0]), std::move(root.children[1]));
	} else if (PatternIsPrefix(patt_str)) {
		// Prefix LIKE pattern : [^%_]*[%]+, ignoring underscore
		return ApplyRule(root, PrefixFun::GetFunction(), patt_str, is_not_like);
	} else if (PatternIsSuffix(patt_str)) {
		// Suffix LIKE pattern: [%]+[^%_]*, ignoring underscore
		return ApplyRule(root, SuffixFun::GetFunction(), patt_str, is_not_like);
	} else if (PatternIsContains(patt_str)) {
		// Contains LIKE pattern: [%]+[^%_]*[%]+, ignoring underscore
		return ApplyRule(root, GetStringContains(), patt_str, is_not_like);
	}
	return nullptr;
}